

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionDiscrete.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
JointActionDiscrete::ConstructIndividualActionDiscretesIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          JointActionDiscrete *this)

{
  uint uVar1;
  pointer ppAVar2;
  iterator __position;
  undefined8 in_RAX;
  pointer ppAVar3;
  Index index;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppAVar3 = (this->_m_apVector).
            super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppAVar2 = (this->_m_apVector).
            super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar3 != ppAVar2) {
    uStack_28 = in_RAX;
    do {
      uVar1 = ((*ppAVar3)->super_DiscreteEntity)._m_index;
      uStack_28 = CONCAT44(uVar1,(undefined4)uStack_28);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                   __position,(uint *)((long)&uStack_28 + 4));
      }
      else {
        *__position._M_current = uVar1;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      ppAVar3 = ppAVar3 + 1;
    } while (ppAVar3 != ppAVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Index> JointActionDiscrete::ConstructIndividualActionDiscretesIndices() const
{
    vector<Index> iv;
    vector<const ActionDiscrete*>::const_iterator it = _m_apVector.begin();
    vector<const ActionDiscrete*>::const_iterator last = _m_apVector.end();
    while(it != last)
    {
        
        Index index = (*it)->GetIndex();
        iv.push_back( index );
        it++;
    }
    return(iv);
}